

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O1

int tree_5_3::layorOrder(Btree t)

{
  long *plVar1;
  ostream *poVar2;
  node *pnVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  Btree pnVar7;
  Btree pnVar8;
  long lVar9;
  Btree q [22];
  long local_d8 [23];
  
  if (t != (Btree)0x0) {
    lVar9 = -1;
    iVar5 = 0;
    do {
      plVar1 = (long *)local_d8[lVar9 + 1];
      printf("%c\t",(ulong)*(uint *)(plVar1 + 2));
      if (*plVar1 != 0) {
        lVar4 = (long)iVar5;
        iVar5 = iVar5 + 1;
        local_d8[lVar4 + 1] = *plVar1;
      }
      if (plVar1[1] != 0) {
        lVar4 = (long)iVar5;
        iVar5 = iVar5 + 1;
        local_d8[lVar4 + 1] = plVar1[1];
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar5);
  }
  pnVar7 = (Btree)0x1050b0;
  poVar2 = std::operator<<((ostream *)&std::cout,"");
  std::endl<char,std::char_traits<char>>(poVar2);
  pnVar8 = *(Btree *)poVar2;
  toThread(pnVar8,pnVar7);
  toThread(pnVar8,(Btree)0x0);
  pnVar7 = (Btree)(ulong)(uint)pnVar8->data;
  printf("%c\t");
  pnVar8 = pnVar8->left;
  preOrderTraverse(pnVar8);
  pnVar3 = pnVar8->left;
  inOrderTraverse((tree_5_3 *)pnVar3,pnVar7);
  pnVar3 = pnVar3->left;
  postOrderTraverse((tree_5_3 *)pnVar3,pnVar7);
  for (; pnVar3 != (node *)0x0; pnVar3 = pnVar3->left) {
    iVar5 = pnVar3->data;
    iVar6 = (int)pnVar7;
    if (iVar5 == iVar6) goto LAB_00102ae4;
    if (iVar5 <= iVar6) {
      if (iVar6 <= iVar5) break;
      pnVar3 = (node *)&pnVar3->right;
    }
  }
  pnVar3 = (node *)0x0;
LAB_00102ae4:
  return (int)pnVar3;
}

Assistant:

int layorOrder(Btree t) {
        Btree p = t, q[22];
        int f, r;
        if (p != nullptr) {
            q[0] = p;
            f = -1;
            r = 0;
            while (f < r) {
                p = q[++f];
                printf("%c\t", p->data);
                if (p->left != nullptr)
                    q[++r] = p->left;
                if (p->right != nullptr)
                    q[++r] = p->right;
            }
        }
        std::cout << "" << std::endl;
    }